

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O2

void SHUFF_OUTPUT_BIT(bit_io_t *bio,int64_t b)

{
  uint64_t *puVar1;
  uint64_t *puVar2;
  
  puVar2 = bio->out_u64;
  *puVar2 = (ulong)(b != 0) + *puVar2 * 2;
  puVar1 = &bio->buff_btg;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 != 0) {
    return;
  }
  bio->out_u64 = puVar2 + 1;
  puVar2[1] = 0;
  bio->buff_btg = 0x40;
  return;
}

Assistant:

inline void SHUFF_OUTPUT_BIT(bit_io_t* bio, int64_t b)
{
    *bio->out_u64 <<= 1;
    if (b)
        *bio->out_u64 |= 1;
    bio->buff_btg--;
    if (bio->buff_btg == 0) {
        SHUFF_OUTPUT_NEXT(bio);
        *bio->out_u64 = 0;
        bio->buff_btg = SHUFF_BUFF_BITS;
    }
}